

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void col_txfm_4x8_rounding(__m128i *in,int shift)

{
  int iVar1;
  undefined1 auVar2 [16];
  char local_244;
  int local_228;
  int iStack_224;
  int iStack_220;
  int iStack_21c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int iStack_88;
  int iStack_84;
  __m128i rounding;
  int shift_local;
  __m128i *in_local;
  int iStack_60;
  int iStack_5c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  local_244 = (char)shift;
  iVar1 = 1 << (local_244 - 1U & 0x1f);
  local_148 = (int)(*in)[0];
  iStack_144 = (int)((ulong)(*in)[0] >> 0x20);
  iStack_140 = (int)(*in)[1];
  iStack_13c = (int)((ulong)(*in)[1] >> 0x20);
  *(int *)*in = local_148 + iVar1;
  *(int *)((long)*in + 4) = iStack_144 + iVar1;
  *(int *)(*in + 1) = iStack_140 + iVar1;
  *(int *)((long)*in + 0xc) = iStack_13c + iVar1;
  local_168 = (int)in[1][0];
  iStack_164 = (int)((ulong)in[1][0] >> 0x20);
  iStack_160 = (int)in[1][1];
  iStack_15c = (int)((ulong)in[1][1] >> 0x20);
  *(int *)in[1] = local_168 + iVar1;
  *(int *)((long)in[1] + 4) = iStack_164 + iVar1;
  *(int *)(in[1] + 1) = iStack_160 + iVar1;
  *(int *)((long)in[1] + 0xc) = iStack_15c + iVar1;
  local_188 = (int)in[2][0];
  iStack_184 = (int)((ulong)in[2][0] >> 0x20);
  iStack_180 = (int)in[2][1];
  iStack_17c = (int)((ulong)in[2][1] >> 0x20);
  *(int *)in[2] = local_188 + iVar1;
  *(int *)((long)in[2] + 4) = iStack_184 + iVar1;
  *(int *)(in[2] + 1) = iStack_180 + iVar1;
  *(int *)((long)in[2] + 0xc) = iStack_17c + iVar1;
  local_1a8 = (int)in[3][0];
  iStack_1a4 = (int)((ulong)in[3][0] >> 0x20);
  iStack_1a0 = (int)in[3][1];
  iStack_19c = (int)((ulong)in[3][1] >> 0x20);
  *(int *)in[3] = local_1a8 + iVar1;
  *(int *)((long)in[3] + 4) = iStack_1a4 + iVar1;
  *(int *)(in[3] + 1) = iStack_1a0 + iVar1;
  *(int *)((long)in[3] + 0xc) = iStack_19c + iVar1;
  local_1c8 = (int)in[4][0];
  iStack_1c4 = (int)((ulong)in[4][0] >> 0x20);
  iStack_1c0 = (int)in[4][1];
  iStack_1bc = (int)((ulong)in[4][1] >> 0x20);
  *(int *)in[4] = local_1c8 + iVar1;
  *(int *)((long)in[4] + 4) = iStack_1c4 + iVar1;
  *(int *)(in[4] + 1) = iStack_1c0 + iVar1;
  *(int *)((long)in[4] + 0xc) = iStack_1bc + iVar1;
  local_1e8 = (int)in[5][0];
  iStack_1e4 = (int)((ulong)in[5][0] >> 0x20);
  iStack_1e0 = (int)in[5][1];
  iStack_1dc = (int)((ulong)in[5][1] >> 0x20);
  *(int *)in[5] = local_1e8 + iVar1;
  *(int *)((long)in[5] + 4) = iStack_1e4 + iVar1;
  *(int *)(in[5] + 1) = iStack_1e0 + iVar1;
  *(int *)((long)in[5] + 0xc) = iStack_1dc + iVar1;
  local_208 = (int)in[6][0];
  iStack_204 = (int)((ulong)in[6][0] >> 0x20);
  iStack_200 = (int)in[6][1];
  iStack_1fc = (int)((ulong)in[6][1] >> 0x20);
  *(int *)in[6] = local_208 + iVar1;
  *(int *)((long)in[6] + 4) = iStack_204 + iVar1;
  *(int *)(in[6] + 1) = iStack_200 + iVar1;
  *(int *)((long)in[6] + 0xc) = iStack_1fc + iVar1;
  local_228 = (int)in[7][0];
  iStack_224 = (int)((ulong)in[7][0] >> 0x20);
  iStack_220 = (int)in[7][1];
  iStack_21c = (int)((ulong)in[7][1] >> 0x20);
  *(int *)in[7] = local_228 + iVar1;
  *(int *)((long)in[7] + 4) = iStack_224 + iVar1;
  *(int *)(in[7] + 1) = iStack_220 + iVar1;
  *(int *)((long)in[7] + 0xc) = iStack_21c + iVar1;
  local_48 = (int)(*in)[0];
  iStack_44 = (int)((ulong)(*in)[0] >> 0x20);
  iStack_40 = (int)(*in)[1];
  iStack_3c = (int)((ulong)(*in)[1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)*in = local_48 >> auVar2;
  *(int *)((long)*in + 4) = iStack_44 >> auVar2;
  *(int *)(*in + 1) = iStack_40 >> auVar2;
  *(int *)((long)*in + 0xc) = iStack_3c >> auVar2;
  in_local._0_4_ = (int)in[1][0];
  in_local._4_4_ = (int)((ulong)in[1][0] >> 0x20);
  iStack_60 = (int)in[1][1];
  iStack_5c = (int)((ulong)in[1][1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)in[1] = (int)in_local >> auVar2;
  *(int *)((long)in[1] + 4) = in_local._4_4_ >> auVar2;
  *(int *)(in[1] + 1) = iStack_60 >> auVar2;
  *(int *)((long)in[1] + 0xc) = iStack_5c >> auVar2;
  iStack_88 = (int)in[2][0];
  iStack_84 = (int)((ulong)in[2][0] >> 0x20);
  rounding[0]._0_4_ = (int)in[2][1];
  rounding[0]._4_4_ = (int)((ulong)in[2][1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)in[2] = iStack_88 >> auVar2;
  *(int *)((long)in[2] + 4) = iStack_84 >> auVar2;
  *(int *)(in[2] + 1) = (int)rounding[0] >> auVar2;
  *(int *)((long)in[2] + 0xc) = rounding[0]._4_4_ >> auVar2;
  local_a8 = (int)in[3][0];
  iStack_a4 = (int)((ulong)in[3][0] >> 0x20);
  iStack_a0 = (int)in[3][1];
  iStack_9c = (int)((ulong)in[3][1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)in[3] = local_a8 >> auVar2;
  *(int *)((long)in[3] + 4) = iStack_a4 >> auVar2;
  *(int *)(in[3] + 1) = iStack_a0 >> auVar2;
  *(int *)((long)in[3] + 0xc) = iStack_9c >> auVar2;
  local_c8 = (int)in[4][0];
  iStack_c4 = (int)((ulong)in[4][0] >> 0x20);
  iStack_c0 = (int)in[4][1];
  iStack_bc = (int)((ulong)in[4][1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)in[4] = local_c8 >> auVar2;
  *(int *)((long)in[4] + 4) = iStack_c4 >> auVar2;
  *(int *)(in[4] + 1) = iStack_c0 >> auVar2;
  *(int *)((long)in[4] + 0xc) = iStack_bc >> auVar2;
  local_e8 = (int)in[5][0];
  iStack_e4 = (int)((ulong)in[5][0] >> 0x20);
  iStack_e0 = (int)in[5][1];
  iStack_dc = (int)((ulong)in[5][1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)in[5] = local_e8 >> auVar2;
  *(int *)((long)in[5] + 4) = iStack_e4 >> auVar2;
  *(int *)(in[5] + 1) = iStack_e0 >> auVar2;
  *(int *)((long)in[5] + 0xc) = iStack_dc >> auVar2;
  local_108 = (int)in[6][0];
  iStack_104 = (int)((ulong)in[6][0] >> 0x20);
  iStack_100 = (int)in[6][1];
  iStack_fc = (int)((ulong)in[6][1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)in[6] = local_108 >> auVar2;
  *(int *)((long)in[6] + 4) = iStack_104 >> auVar2;
  *(int *)(in[6] + 1) = iStack_100 >> auVar2;
  *(int *)((long)in[6] + 0xc) = iStack_fc >> auVar2;
  local_128 = (int)in[7][0];
  iStack_124 = (int)((ulong)in[7][0] >> 0x20);
  iStack_120 = (int)in[7][1];
  iStack_11c = (int)((ulong)in[7][1] >> 0x20);
  auVar2 = ZEXT416((uint)shift);
  *(int *)in[7] = local_128 >> auVar2;
  *(int *)((long)in[7] + 4) = iStack_124 >> auVar2;
  *(int *)(in[7] + 1) = iStack_120 >> auVar2;
  *(int *)((long)in[7] + 0xc) = iStack_11c >> auVar2;
  return;
}

Assistant:

static inline void col_txfm_4x8_rounding(__m128i *in, int shift) {
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));

  in[0] = _mm_add_epi32(in[0], rounding);
  in[1] = _mm_add_epi32(in[1], rounding);
  in[2] = _mm_add_epi32(in[2], rounding);
  in[3] = _mm_add_epi32(in[3], rounding);
  in[4] = _mm_add_epi32(in[4], rounding);
  in[5] = _mm_add_epi32(in[5], rounding);
  in[6] = _mm_add_epi32(in[6], rounding);
  in[7] = _mm_add_epi32(in[7], rounding);

  in[0] = _mm_srai_epi32(in[0], shift);
  in[1] = _mm_srai_epi32(in[1], shift);
  in[2] = _mm_srai_epi32(in[2], shift);
  in[3] = _mm_srai_epi32(in[3], shift);
  in[4] = _mm_srai_epi32(in[4], shift);
  in[5] = _mm_srai_epi32(in[5], shift);
  in[6] = _mm_srai_epi32(in[6], shift);
  in[7] = _mm_srai_epi32(in[7], shift);
}